

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

char * mpack_expect_cstr_alloc_unchecked(mpack_reader_t *reader,size_t maxsize,size_t *out_length)

{
  uint32_t uVar1;
  char *str;
  size_t length;
  size_t *out_length_local;
  size_t maxsize_local;
  mpack_reader_t *reader_local;
  
  *out_length = 0;
  if (maxsize == 0) {
    mpack_reader_flag_error(reader,mpack_error_bug);
    reader_local = (mpack_reader_t *)0x0;
  }
  else {
    out_length_local = (size_t *)maxsize;
    if (0xffffffff < maxsize) {
      out_length_local = (size_t *)0xffffffff;
    }
    uVar1 = mpack_expect_str_max(reader,(int)out_length_local - 1);
    reader_local = (mpack_reader_t *)mpack_read_bytes_alloc_impl(reader,(ulong)uVar1,true);
    mpack_done_str(reader);
    if (reader_local != (mpack_reader_t *)0x0) {
      *out_length = (ulong)uVar1;
    }
  }
  return (char *)reader_local;
}

Assistant:

static char* mpack_expect_cstr_alloc_unchecked(mpack_reader_t* reader, size_t maxsize, size_t* out_length) {
    mpack_assert(out_length != NULL, "out_length cannot be NULL");
    *out_length = 0;

    // make sure argument makes sense
    if (maxsize < 1) {
        mpack_break("maxsize is zero; you must have room for at least a null-terminator");
        mpack_reader_flag_error(reader, mpack_error_bug);
        return NULL;
    }

    if (maxsize > UINT32_MAX)
        maxsize = UINT32_MAX;

    size_t length = mpack_expect_str_max(reader, (uint32_t)maxsize - 1);
    char* str = mpack_read_bytes_alloc_impl(reader, length, true);
    mpack_done_str(reader);

    if (str)
        *out_length = length;
    return str;
}